

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O1

bool __thiscall OSToken::deleteObject(OSToken *this,OSObject *object)

{
  _Rb_tree_header *p_Var1;
  Directory *pDVar2;
  OSObject *pOVar3;
  int iVar4;
  ObjectFile *this_00;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  char cVar7;
  pair<std::_Rb_tree_iterator<OSObject_*>,_std::_Rb_tree_iterator<OSObject_*>_> pVar8;
  string objectFilename;
  string lockFilename;
  MutexLocker lock;
  OSObject *local_c0;
  string local_b8;
  string local_98;
  MutexLocker local_78;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (this->valid == true) {
    p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0;
        p_Var6 = (&p_Var6->_M_left)[*(OSObject **)(p_Var6 + 1) < object]) {
      if (*(OSObject **)(p_Var6 + 1) >= object) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (p_Var6 = p_Var5, object < *(OSObject **)(p_Var5 + 1))) {
      p_Var6 = &p_Var1->_M_header;
    }
    local_c0 = object;
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      cVar7 = '\0';
      softHSMLog(3,"deleteObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x183,"Cannot delete non-existent object 0x%08X");
    }
    else {
      MutexLocker::MutexLocker(&local_78,this->tokenMutex);
      pOVar3 = local_c0;
      if (local_c0 == (OSObject *)0x0) {
        this_00 = (ObjectFile *)0x0;
      }
      else {
        this_00 = (ObjectFile *)__dynamic_cast(local_c0,&OSObject::typeinfo,&ObjectFile::typeinfo,0)
        ;
      }
      if (this_00 == (ObjectFile *)0x0) {
        cVar7 = '\0';
        softHSMLog(3,"deleteObject",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x18d,"Object type not compatible with this token class 0x%08X",pOVar3);
      }
      else {
        ObjectFile::invalidate(this_00);
        ObjectFile::getFilename_abi_cxx11_(&local_b8,this_00);
        pDVar2 = this->tokenDir;
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,local_b8._M_dataplus._M_p,
                   local_b8._M_dataplus._M_p + local_b8._M_string_length);
        iVar4 = Directory::remove(pDVar2,(char *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0]);
        }
        if ((char)iVar4 == '\0') {
          cVar7 = '\0';
          softHSMLog(3,"deleteObject",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x19b,"Failed to delete object file %s",local_b8._M_dataplus._M_p);
        }
        else {
          ObjectFile::getLockname_abi_cxx11_(&local_98,this_00);
          pDVar2 = this->tokenDir;
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_68,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          iVar4 = Directory::remove(pDVar2,(char *)local_68);
          cVar7 = (char)iVar4;
          if (local_68[0] != local_58) {
            operator_delete(local_68[0]);
          }
          if (cVar7 == '\0') {
            softHSMLog(3,"deleteObject",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x1a6,"Failed to delete lock file %s",local_98._M_dataplus._M_p);
          }
          else {
            pVar8 = std::
                    _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
                    ::equal_range(&(this->objects)._M_t,&local_c0);
            std::
            _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
            ::_M_erase_aux(&(this->objects)._M_t,(_Base_ptr)pVar8.first._M_node,
                           (_Base_ptr)pVar8.second._M_node);
            softHSMLog(7,"deleteObject",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x1ad,"Deleted object %s",local_b8._M_dataplus._M_p);
            Generation::update(this->gen);
            Generation::commit(this->gen);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
      MutexLocker::~MutexLocker(&local_78);
    }
  }
  else {
    cVar7 = '\0';
  }
  return (bool)cVar7;
}

Assistant:

bool OSToken::deleteObject(OSObject* object)
{
	if (!valid) return false;

	if (objects.find(object) == objects.end())
	{
		ERROR_MSG("Cannot delete non-existent object 0x%08X", object);

		return false;
	}

	MutexLocker lock(tokenMutex);

	ObjectFile* fileObject = dynamic_cast<ObjectFile*>(object);
	if (fileObject == NULL)
	{
		ERROR_MSG("Object type not compatible with this token class 0x%08X", object);

		return false;
	}

	// Invalidate the object instance
	fileObject->invalidate();

	// Retrieve the filename of the object
	std::string objectFilename = fileObject->getFilename();

	// Attempt to delete the file
	if (!tokenDir->remove(objectFilename))
	{
		ERROR_MSG("Failed to delete object file %s", objectFilename.c_str());

		return false;
	}

	// Retrieve the filename of the lock
	std::string lockFilename = fileObject->getLockname();

	// Attempt to delete the lock
	if (!tokenDir->remove(lockFilename))
	{
		ERROR_MSG("Failed to delete lock file %s", lockFilename.c_str());

		return false;
	}

	objects.erase(object);

	DEBUG_MSG("Deleted object %s", objectFilename.c_str());

	gen->update();

	gen->commit();

	return true;
}